

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O3

void __thiscall despot::BaseRockSample::PrintBelief(BaseRockSample *this)

{
  ostream *in_RDX;
  Belief *in_RSI;
  
  PrintBelief((BaseRockSample *)
              &this[-1].transition_probabilities_.
               super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,in_RSI,in_RDX);
  return;
}

Assistant:

void BaseRockSample::PrintBelief(const Belief& belief, ostream& out) const {
	const vector<State*>& particles =
		static_cast<const ParticleBelief&>(belief).particles();

	vector<double> rock_probs(num_rocks_);
	vector<double> pos_probs(size_ * size_);
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		for (int rock = 0; rock < num_rocks_; rock++)
			rock_probs[rock] += CheckFlag(particle->state_id, rock)
				* particle->weight;
		pos_probs[particle->state_id >> num_rocks_] += particle->weight;
	}

	out << "Rock belief:";
	for (int rock = 0; rock < num_rocks_; rock++)
		out << " " << rock_probs[rock];
	out << endl;

	out << "Position belief:";
	for (int i = 0; i < pos_probs.size(); i++) {
		if (pos_probs[i] > 0)
			out << " " << IndexToCoord(i) << ":" << pos_probs[i];
	}
	out << endl;
}